

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_enable_debug_mode(void)

{
  char *fmt;
  
  if (event_debug_mode_on_ == 0) {
    if (event_debug_mode_too_late != '\x01') {
      event_debug_mode_on_ = 1;
      global_debug_map.hth_table = (event_debug_entry **)0x0;
      global_debug_map.hth_table_length = 0;
      global_debug_map.hth_n_entries = 0;
      global_debug_map.hth_load_limit = 0;
      global_debug_map.hth_prime_idx = -1;
      return;
    }
    fmt = "%s must be called *before* creating any events or event_bases";
  }
  else {
    fmt = "%s was called twice!";
  }
  event_errx(1,fmt,"event_enable_debug_mode");
}

Assistant:

void
event_enable_debug_mode(void)
{
#ifndef EVENT__DISABLE_DEBUG_MODE
	if (event_debug_mode_on_)
		event_errx(1, "%s was called twice!", __func__);
	if (event_debug_mode_too_late)
		event_errx(1, "%s must be called *before* creating any events "
		    "or event_bases",__func__);

	event_debug_mode_on_ = 1;

	HT_INIT(event_debug_map, &global_debug_map);
#endif
}